

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

void __thiscall Assimp::D3DS::Mesh::~Mesh(Mesh *this)

{
  Mesh *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->mFaceMaterials);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->mTexCoords);
  std::__cxx11::string::~string((string *)&this->mName);
  MeshWithSmoothingGroups<Assimp::D3DS::Face>::~MeshWithSmoothingGroups
            (&this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>);
  return;
}

Assistant:

Mesh() = delete;